

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Viper.cpp
# Opt level: O0

void __thiscall chrono::viper::Viper::Update(Viper *this)

{
  double y_constant;
  int iVar1;
  element_type *peVar2;
  reference pvVar3;
  __shared_ptr_access<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var4;
  element_type *peVar5;
  __shared_ptr_access<chrono::ChFunction_Setpoint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *this_00;
  element_type *peVar6;
  double lifting;
  double steering;
  double driving;
  double dStack_18;
  int i;
  double time;
  Viper *this_local;
  
  time = (double)this;
  dStack_18 = ChSystem::GetChTime(this->m_system);
  peVar2 = std::
           __shared_ptr_access<chrono::viper::ViperDriver,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<chrono::viper::ViperDriver,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->m_driver);
  (*peVar2->_vptr_ViperDriver[3])(dStack_18);
  for (driving._4_4_ = 0; driving._4_4_ < 4; driving._4_4_ = driving._4_4_ + 1) {
    peVar2 = std::
             __shared_ptr_access<chrono::viper::ViperDriver,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<chrono::viper::ViperDriver,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m_driver);
    pvVar3 = std::array<double,_4UL>::operator[](&peVar2->drive_speeds,(long)driving._4_4_);
    steering = *pvVar3;
    peVar2 = std::
             __shared_ptr_access<chrono::viper::ViperDriver,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<chrono::viper::ViperDriver,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m_driver);
    pvVar3 = std::array<double,_4UL>::operator[](&peVar2->steer_angles,(long)driving._4_4_);
    lifting = *pvVar3;
    peVar2 = std::
             __shared_ptr_access<chrono::viper::ViperDriver,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<chrono::viper::ViperDriver,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m_driver);
    pvVar3 = std::array<double,_4UL>::operator[](&peVar2->lift_angles,(long)driving._4_4_);
    y_constant = *pvVar3;
    ChClampValue<double>(&lifting,-0.5235987755982988,0.5235987755982988);
    p_Var4 = (__shared_ptr_access<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)std::array<std::shared_ptr<chrono::ChFunction_Const>,_4UL>::operator[]
                          (&this->m_steer_motor_funcs,(long)driving._4_4_);
    peVar5 = std::
             __shared_ptr_access<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(p_Var4);
    ChFunction_Const::Set_yconst(peVar5,lifting);
    p_Var4 = (__shared_ptr_access<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)std::array<std::shared_ptr<chrono::ChFunction_Const>,_4UL>::operator[]
                          (&this->m_lift_motor_funcs,(long)driving._4_4_);
    peVar5 = std::
             __shared_ptr_access<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(p_Var4);
    ChFunction_Const::Set_yconst(peVar5,y_constant);
    peVar2 = std::
             __shared_ptr_access<chrono::viper::ViperDriver,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<chrono::viper::ViperDriver,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->m_driver);
    iVar1 = (*peVar2->_vptr_ViperDriver[2])();
    if (iVar1 == 0) {
      this_00 = (__shared_ptr_access<chrono::ChFunction_Setpoint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)std::array<std::shared_ptr<chrono::ChFunction_Setpoint>,_4UL>::operator[]
                             (&this->m_drive_motor_funcs,(long)driving._4_4_);
      peVar6 = std::
               __shared_ptr_access<chrono::ChFunction_Setpoint,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(this_00);
      (**(code **)(*(long *)peVar6 + 0xd0))(steering,dStack_18);
    }
  }
  return;
}

Assistant:

void Viper::Update() {
    double time = m_system->GetChTime();
    m_driver->Update(time);

    for (int i = 0; i < 4; i++) {
        // Extract driver inputs
        double driving = m_driver->drive_speeds[i];
        double steering = m_driver->steer_angles[i];
        double lifting = m_driver->lift_angles[i];

        // Enforce maximum steering angle
        ChClampValue(steering, -m_max_steer_angle, +m_max_steer_angle);

        // Set motor functions
        m_steer_motor_funcs[i]->Set_yconst(steering);
        m_lift_motor_funcs[i]->Set_yconst(lifting);
        if (m_driver->GetDriveMotorType() == ViperDriver::DriveMotorType::SPEED)
            m_drive_motor_funcs[i]->SetSetpoint(driving, time);
    }
}